

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O1

void garray_width(_garray *x,t_floatarg width)

{
  t_template *x_00;
  t_symbol *ptVar1;
  t_float tVar2;
  float f;
  
  x_00 = template_findbyname(x->x_scalar->sc_template);
  if (x_00 == (t_template *)0x0) {
    pd_error((void *)0x0,"array: no template of type %s",x->x_scalar->sc_template->s_name);
    return;
  }
  ptVar1 = gensym("linewidth");
  tVar2 = template_getfloat(x_00,ptVar1,x->x_scalar->sc_vec,1);
  f = 1.0;
  if (1.0 <= width) {
    f = width;
  }
  if ((f == tVar2) && (!NAN(f) && !NAN(tVar2))) {
    return;
  }
  ptVar1 = gensym("linewidth");
  template_setfloat(x_00,ptVar1,x->x_scalar->sc_vec,f,0);
  garray_redraw(x);
  return;
}

Assistant:

static void garray_width(t_garray *x, t_floatarg width)
{
    t_float widthwas;
    t_template *scalartemplate;
    if (!(scalartemplate = template_findbyname(x->x_scalar->sc_template)))
    {
        pd_error(0, "array: no template of type %s",
            x->x_scalar->sc_template->s_name);
        return;
    }
    widthwas = template_getfloat(
        scalartemplate, gensym("linewidth"), x->x_scalar->sc_vec, 1);
    if (width < 1) width = 1;
    if (width != widthwas)
    {
        template_setfloat(scalartemplate, gensym("linewidth"),
            x->x_scalar->sc_vec, width, 0);
        garray_redraw(x);
    }
}